

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::HttpService::Response::sendError
          (Response *this,uint statusCode,StringPtr statusText,HttpHeaders *headers)

{
  undefined1 *puVar1;
  PromiseNode *extraout_RDX;
  undefined4 in_register_00000034;
  Promise<void> PVar2;
  Promise<void> promise;
  Own<kj::AsyncOutputStream> stream;
  Own<kj::AsyncOutputStream> local_50;
  Own<kj::AsyncOutputStream> local_40;
  undefined1 local_30;
  undefined1 *local_28;
  
  puVar1 = (undefined1 *)((long)&headers[-1].ownedStrings.builder.disposer + 7);
  local_30 = 1;
  local_28 = puVar1;
  (*(code *)**(undefined8 **)CONCAT44(in_register_00000034,statusCode))
            (&local_40,(undefined8 *)CONCAT44(in_register_00000034,statusCode),
             statusText.content.ptr);
  (**(local_40.ptr)->_vptr_AsyncOutputStream)
            (&local_50,local_40.ptr,statusText.content.size_,puVar1);
  Promise<void>::attach<kj::Own<kj::AsyncOutputStream>>((Promise<void> *)this,&local_50);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_50);
  Own<kj::AsyncOutputStream>::dispose(&local_40);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> HttpService::Response::sendError(
    uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers) {
  auto stream = send(statusCode, statusText, headers, statusText.size());
  auto promise = stream->write(statusText.begin(), statusText.size());
  return promise.attach(kj::mv(stream));
}